

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugIn.cpp
# Opt level: O0

void OpenSteer::PlugIn::sortBySelectionOrder(void)

{
  PlugIn *pPVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  PlugIn *temporary;
  float jKey;
  float iKey;
  int j;
  int i;
  int local_8;
  int local_4;
  
  for (local_4 = 0; local_8 = local_4, local_4 < itemsInRegistry + -1; local_4 = local_4 + 1) {
    while (local_8 = local_8 + 1, local_8 < itemsInRegistry) {
      (*(registry[local_4]->super_AbstractPlugIn)._vptr_AbstractPlugIn[8])();
      (*(registry[local_8]->super_AbstractPlugIn)._vptr_AbstractPlugIn[8])();
      if (extraout_XMM0_Da_00 < extraout_XMM0_Da) {
        pPVar1 = registry[local_4];
        registry[local_4] = registry[local_8];
        registry[local_8] = pPVar1;
      }
    }
  }
  return;
}

Assistant:

void 
OpenSteer::PlugIn::sortBySelectionOrder (void)
{
    // I know, I know, just what the world needs:
    // another inline shell sort implementation...

    // starting at each of the first n-1 elements of the array
    for (int i = 0; i < itemsInRegistry-1; i++)
    {
        // scan over subsequent pairs, swapping if larger value is first
        for (int j = i+1; j < itemsInRegistry; j++)
        {
            const float iKey = registry[i]->selectionOrderSortKey ();
            const float jKey = registry[j]->selectionOrderSortKey ();

            if (iKey > jKey)
            {
                PlugIn* temporary = registry[i];
                registry[i] = registry[j];
                registry[j] = temporary;
            }
        }
    }
}